

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar4;
  uchar *ptr_6;
  uchar *outptr_6;
  int size_3;
  int p_2;
  Mat *top_blob_6;
  int slice_6;
  size_t i_6;
  int q_6;
  int channels_3;
  int d_3;
  int h_5;
  int w_6;
  uchar *ptr_5;
  int k;
  int j_2;
  Mat m_3;
  uchar *outptr_5;
  int p_1;
  Mat *top_blob_5;
  int slice_5;
  size_t i_5;
  int q_5;
  int channels_2;
  int d_2;
  int h_4;
  int w_5;
  uchar *ptr_4;
  uchar *outptr_4;
  int size_2;
  int j_1;
  int p;
  Mat *top_blob_4;
  int slice_4;
  size_t i_4;
  int q_4;
  int channels_1;
  int d_1;
  int h_3;
  int w_4;
  uchar *outptr_3;
  uchar *ptr_3;
  int size_1;
  Mat *top_blob_3;
  int slice_3;
  size_t i_3;
  int q_3;
  int channels;
  int d;
  int h_2;
  int w_3;
  uchar *ptr_2;
  uchar *outptr_2;
  int j;
  Mat *top_blob_2;
  int slice_2;
  size_t i_2;
  int q_2;
  int h_1;
  int w_2;
  uchar *outptr_1;
  uchar *ptr_1;
  int size;
  Mat *top_blob_1;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  uchar *outptr;
  uchar *ptr;
  Mat *top_blob;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *slices_ptr;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *m_7;
  Mat *m_5;
  Mat *m_2;
  Mat *m;
  Mat *m_6;
  Mat *m_4;
  Mat *m_1;
  Mat *in_stack_ffffffffffffefc8;
  undefined8 *in_stack_ffffffffffffefd0;
  void *in_stack_ffffffffffffefd8;
  Mat *in_stack_ffffffffffffefe0;
  Allocator *in_stack_fffffffffffff040;
  int local_dd4;
  Mat local_dc8;
  undefined8 local_d80;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined4 local_d68;
  Allocator *local_d60;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined8 local_d40;
  void *local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  undefined8 local_d20;
  undefined4 local_d18;
  Allocator *local_d10;
  undefined4 local_d08;
  undefined4 local_d04;
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined8 local_cf0;
  void *local_ce8;
  int local_ce0;
  int local_cdc;
  reference local_cd8;
  int local_ccc;
  ulong local_cc8;
  int local_cbc;
  int local_cb8;
  int local_cb4;
  int local_cb0;
  int local_cac;
  undefined8 local_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined4 local_c90;
  Allocator *local_c88;
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  undefined8 local_c68;
  void *local_c60;
  int local_c58;
  int local_c54;
  void *local_c50;
  int *local_c48;
  ulong local_c40;
  int local_c38;
  Allocator *local_c30;
  int local_c28;
  int local_c24;
  int local_c20;
  undefined4 local_c1c;
  int local_c18;
  ulong local_c10;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined4 local_bf0;
  Allocator *local_be8;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined8 local_bc8;
  void *local_bc0;
  int local_bb4;
  reference local_bb0;
  int local_ba4;
  ulong local_ba0;
  int local_b94;
  int local_b90;
  int local_b8c;
  int local_b88;
  int local_b84;
  undefined8 local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined4 local_b68;
  Allocator *local_b60;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined8 local_b30;
  undefined8 local_b28;
  undefined4 local_b20;
  Allocator *local_b18;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined4 local_b08;
  undefined4 local_b04;
  undefined4 local_b00;
  undefined8 local_af8;
  void *local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined4 local_ad0;
  Allocator *local_ac8;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined8 local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined4 local_a88;
  Allocator *local_a80;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined8 local_a60;
  void *local_a58;
  int local_a4c;
  int local_a48;
  int local_a44;
  reference local_a40;
  int local_a34;
  ulong local_a30;
  int local_a24;
  int local_a20;
  int local_a1c;
  int local_a18;
  int local_a14;
  void *local_a10;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined8 local_9e8;
  undefined4 local_9e0;
  Allocator *local_9d8;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined8 local_9b8;
  void *local_9b0;
  int local_9a4;
  reference local_9a0;
  int local_994;
  ulong local_990;
  int local_984;
  int local_980;
  int local_97c;
  int local_978;
  int local_974;
  void *local_970;
  void *local_968;
  int local_95c;
  reference local_958;
  int local_94c;
  ulong local_948;
  int local_93c;
  int local_938;
  int local_934;
  void *local_930;
  void *local_928;
  int local_91c;
  reference local_918;
  int local_90c;
  ulong local_908;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  void *local_8f0;
  void *local_8e8;
  reference local_8e0;
  int local_8d4;
  ulong local_8d0;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  long local_8b8;
  size_t local_8b0;
  int local_8a4;
  const_reference local_8a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_890;
  undefined8 *local_870;
  undefined8 *local_860;
  undefined8 *local_850;
  undefined8 *local_840;
  undefined8 *local_830;
  undefined8 *local_820;
  undefined8 *local_810;
  void **local_800;
  undefined8 *local_7f0;
  undefined8 *local_7e0;
  Mat *local_7d0;
  long *local_7c0;
  reference local_7b8;
  reference local_7b0;
  reference local_7a8;
  reference local_7a0;
  reference local_798;
  reference local_790;
  reference local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  const_reference local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  reference local_750;
  reference local_748;
  reference local_740;
  int local_734;
  undefined8 *local_730;
  int local_724;
  undefined8 *local_720;
  int local_714;
  const_reference local_710;
  int local_704;
  const_reference local_700;
  int local_6f4;
  reference local_6f0;
  undefined1 local_6e5;
  int local_6e4;
  const_reference local_6e0;
  Mat *local_6d8;
  undefined1 local_6c5;
  int local_6c4;
  const_reference local_6c0;
  void **local_6b8;
  undefined1 local_6a5;
  int local_6a4;
  const_reference local_6a0;
  undefined8 *local_698;
  undefined1 local_685;
  int local_684;
  const_reference local_680;
  undefined8 *local_678;
  undefined1 local_665;
  int local_664;
  reference local_660;
  undefined8 *local_658;
  undefined1 local_645;
  int local_644;
  reference local_640;
  undefined8 *local_638;
  undefined1 local_625;
  int local_624;
  reference local_620;
  undefined8 *local_618;
  int local_604;
  undefined8 *local_600;
  undefined8 *local_5f8;
  int local_5ec;
  Mat *local_5e8;
  undefined8 *local_5e0;
  int local_5d4;
  void **local_5d0;
  undefined8 *local_5c8;
  int local_5bc;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  Mat *local_520;
  undefined8 *local_500;
  undefined8 *local_4e0;
  int local_4c8;
  undefined4 local_4c4;
  void **local_4c0;
  undefined8 *local_4a0;
  undefined8 *local_480;
  undefined8 *local_460;
  undefined8 *local_440;
  undefined8 *local_420;
  undefined8 *local_400;
  undefined8 *local_3e0;
  void *local_368;
  reference local_2f0;
  reference local_2e8;
  reference local_2e0;
  reference local_2d8;
  reference local_2d0;
  reference local_2c8;
  reference local_2c0;
  Allocator *local_2b8;
  int local_2ac;
  size_t local_2a8;
  void *local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  Allocator *local_280;
  int local_274;
  size_t local_270;
  void *local_268;
  int local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  Allocator *local_248;
  int local_23c;
  size_t local_238;
  void *local_230;
  int local_224;
  int local_220;
  int local_21c;
  undefined8 *local_218;
  Allocator *local_210;
  int local_204;
  size_t local_200;
  void *local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  Allocator *local_1d8;
  int local_1cc;
  size_t local_1c8;
  void *local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 *local_1a8;
  Allocator *local_1a0;
  int local_194;
  ulong local_190;
  void *local_188;
  int local_17c;
  int local_178;
  int local_174;
  void **local_170;
  Allocator *local_168;
  int local_15c;
  size_t local_158;
  void *local_150;
  int local_144;
  int local_140;
  int local_13c;
  Mat *local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  Allocator *local_c0;
  int local_b4;
  size_t local_b0;
  void *local_a8;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  Allocator *local_90;
  int local_84;
  ulong local_80;
  void *local_78;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_890 = in_RDX;
  local_8a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_8a4 = local_8a0->dims;
  local_8b0 = local_8a0->elemsize;
  local_7c0 = (long *)(in_RDI + 0xd0);
  local_8b8 = *local_7c0;
  if (*(int *)(in_RDI + 0x118) < 0) {
    local_dd4 = local_8a4 + *(int *)(in_RDI + 0x118);
  }
  else {
    local_dd4 = *(int *)(in_RDI + 0x118);
  }
  local_8bc = local_dd4;
  if (local_8a4 == 1) {
    local_8c0 = local_8a0->w;
    local_8c4 = 0;
    local_8a4 = 1;
    for (local_8d0 = 0; uVar1 = local_8d0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_8d0 = local_8d0 + 1) {
      local_8d4 = *(int *)(local_8b8 + local_8d0 * 4);
      if (local_8d4 == -0xe9) {
        iVar2 = local_8c0 - local_8c4;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_8d4 = (int)((ulong)(long)iVar2 / (sVar3 - local_8d0));
      }
      local_8e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_8d0);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (size_t)in_stack_ffffffffffffefd0,(Allocator *)in_stack_ffffffffffffefc8);
      local_788 = local_8e0;
      bVar4 = true;
      if (local_8e0->data != (void *)0x0) {
        local_2f0 = local_8e0;
        bVar4 = local_8e0->cstep * (long)local_8e0->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_770 = local_8a0;
      local_8e8 = (void *)((long)local_8a0->data + (long)local_8c4 * local_8b0);
      local_740 = local_8e0;
      local_8f0 = local_8e0->data;
      memcpy(local_8f0,local_8e8,(long)local_8d4 * local_8b0);
      local_8c4 = local_8d4 + local_8c4;
    }
  }
  else if ((local_8a4 == 2) && (local_dd4 == 0)) {
    local_8f4 = local_8a0->w;
    local_8f8 = local_8a0->h;
    local_8fc = 0;
    local_8a4 = 2;
    for (local_908 = 0; uVar1 = local_908,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_908 = local_908 + 1) {
      local_90c = *(int *)(local_8b8 + local_908 * 4);
      if (local_90c == -0xe9) {
        iVar2 = local_8f8 - local_8fc;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_90c = (int)((ulong)(long)iVar2 / (sVar3 - local_908));
      }
      local_918 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_908);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (int)in_stack_ffffffffffffefd8,(size_t)in_stack_ffffffffffffefd0,
                  (Allocator *)in_stack_ffffffffffffefc8);
      local_790 = local_918;
      bVar4 = true;
      if (local_918->data != (void *)0x0) {
        local_2e8 = local_918;
        bVar4 = local_918->cstep * (long)local_918->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_91c = local_8f4 * local_90c;
      local_700 = local_8a0;
      local_704 = local_8fc;
      local_928 = (void *)((long)local_8a0->data +
                          (long)local_8a0->w * (long)local_8fc * local_8a0->elemsize);
      local_748 = local_918;
      local_930 = local_918->data;
      memcpy(local_930,local_928,(long)local_91c * local_8b0);
      local_8fc = local_90c + local_8fc;
    }
  }
  else if ((local_8a4 == 2) && (local_dd4 == 1)) {
    local_934 = local_8a0->w;
    local_938 = local_8a0->h;
    local_93c = 0;
    local_8a4 = 2;
    for (local_948 = 0; uVar1 = local_948,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_948 = local_948 + 1) {
      local_94c = *(int *)(local_8b8 + local_948 * 4);
      if (local_94c == -0xe9) {
        iVar2 = local_934 - local_93c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_94c = (int)((ulong)(long)iVar2 / (sVar3 - local_948));
      }
      local_958 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_948);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (int)in_stack_ffffffffffffefd8,(size_t)in_stack_ffffffffffffefd0,
                  (Allocator *)in_stack_ffffffffffffefc8);
      local_798 = local_958;
      bVar4 = true;
      if (local_958->data != (void *)0x0) {
        local_2e0 = local_958;
        bVar4 = local_958->cstep * (long)local_958->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      for (local_95c = 0; local_95c < local_938; local_95c = local_95c + 1) {
        local_6f0 = local_958;
        local_6f4 = local_95c;
        local_968 = (void *)((long)local_958->data +
                            (long)local_958->w * (long)local_95c * local_958->elemsize);
        local_710 = local_8a0;
        local_714 = local_95c;
        local_970 = (void *)((long)local_8a0->data +
                            (long)local_93c * local_8b0 +
                            (long)local_8a0->w * (long)local_95c * local_8a0->elemsize);
        memcpy(local_968,local_970,(long)local_94c * local_8b0);
      }
      local_93c = local_94c + local_93c;
    }
  }
  else if (((local_8a4 == 3) || (local_8a4 == 4)) && (local_dd4 == 0)) {
    local_974 = local_8a0->w;
    local_978 = local_8a0->h;
    local_97c = local_8a0->d;
    local_980 = local_8a0->c;
    local_984 = 0;
    for (local_990 = 0; uVar1 = local_990,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_990 = local_990 + 1) {
      local_994 = *(int *)(local_8b8 + local_990 * 4);
      if (local_994 == -0xe9) {
        iVar2 = local_980 - local_984;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_994 = (int)((ulong)(long)iVar2 / (sVar3 - local_990));
      }
      local_9a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_990);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (int)in_stack_ffffffffffffefd8,(int)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
                  (int)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                  in_stack_fffffffffffff040);
      bVar4 = true;
      if (local_9a0->data != (void *)0x0) {
        local_2d8 = local_9a0;
        bVar4 = local_9a0->cstep * (long)local_9a0->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_9a0->dims = local_8a4;
      local_9a4 = (int)local_8a0->cstep * local_994;
      local_678 = &local_9f8;
      local_1e4 = local_8a0->w;
      local_1e8 = local_8a0->h;
      local_1ec = local_8a0->d;
      local_9b0 = (void *)((long)local_8a0->data +
                          local_8a0->cstep * (long)local_984 * local_8a0->elemsize);
      local_200 = local_8a0->elemsize;
      local_204 = local_8a0->elempack;
      local_210 = local_8a0->allocator;
      local_1e0 = &local_9f8;
      local_f8 = (long)local_1e4 * (long)local_1e8 * local_200;
      local_778 = &local_9f8;
      local_870 = &local_9f8;
      local_fc = 0x10;
      local_680 = local_8a0;
      local_684 = local_984;
      local_685 = 1;
      local_7a0 = local_9a0;
      local_9f8 = 0;
      local_9e8 = 0;
      local_9e0 = 0;
      local_9d0 = 0;
      local_9cc = 0;
      local_9c8 = 0;
      local_9c4 = 0;
      local_9c0 = 0;
      local_9b8 = 0;
      local_9f0 = 0;
      local_750 = local_9a0;
      local_a10 = local_9a0->data;
      local_3e0 = local_870;
      local_1f8 = local_9b0;
      local_9d8 = local_210;
      memcpy(local_a10,local_9b0,(long)local_9a4 * local_8b0);
      local_984 = local_994 + local_984;
    }
  }
  else if (((local_8a4 == 3) && (local_dd4 == 1)) || ((local_8a4 == 4 && (local_dd4 == 2)))) {
    local_a14 = local_8a0->w;
    local_a18 = local_8a0->h;
    local_a1c = local_8a0->d;
    local_a20 = local_8a0->c;
    local_a24 = 0;
    for (local_a30 = 0; uVar1 = local_a30,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_a30 = local_a30 + 1) {
      local_a34 = *(int *)(local_8b8 + local_a30 * 4);
      if (local_a34 == -0xe9) {
        iVar2 = local_a18 - local_a24;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_a34 = (int)((ulong)(long)iVar2 / (sVar3 - local_a30));
      }
      local_a40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_a30);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (int)in_stack_ffffffffffffefd8,(int)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
                  (int)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                  in_stack_fffffffffffff040);
      local_7a8 = local_a40;
      bVar4 = true;
      if (local_a40->data != (void *)0x0) {
        local_2d0 = local_a40;
        bVar4 = local_a40->cstep * (long)local_a40->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_a40->dims = local_8a4;
      for (local_a44 = 0; local_a44 < local_a20; local_a44 = local_a44 + 1) {
        for (local_a48 = 0; local_a48 < local_a1c; local_a48 = local_a48 + 1) {
          local_a4c = local_a14 * local_a34;
          local_618 = &local_ae8;
          local_28c = local_a40->w;
          local_290 = local_a40->h;
          local_294 = local_a40->d;
          local_2a0 = (void *)((long)local_a40->data +
                              local_a40->cstep * (long)local_a44 * local_a40->elemsize);
          local_2a8 = local_a40->elemsize;
          local_2ac = local_a40->elempack;
          local_2b8 = local_a40->allocator;
          local_288 = &local_ae8;
          local_c8 = (long)local_28c * (long)local_290 * local_2a8;
          local_5f8 = &local_aa0;
          local_600 = &local_ae8;
          local_a58 = (void *)((long)local_2a0 +
                              (long)local_28c * (long)local_290 * (long)local_a48 * local_2a8);
          local_8 = &local_aa0;
          local_758 = &local_aa0;
          local_860 = &local_aa0;
          local_850 = &local_ae8;
          local_698 = &local_b80;
          local_1ac = local_8a0->w;
          local_1b0 = local_8a0->h;
          local_1b4 = local_8a0->d;
          local_1c0 = (void *)((long)local_8a0->data +
                              local_8a0->cstep * (long)local_a44 * local_8a0->elemsize);
          local_1c8 = local_8a0->elemsize;
          local_1cc = local_8a0->elempack;
          local_1d8 = local_8a0->allocator;
          local_1a8 = &local_b80;
          local_108 = (long)local_1ac * (long)local_1b0 * local_1c8;
          local_5b0 = &local_b38;
          local_5b8 = &local_b80;
          local_a8 = (void *)((long)local_1c0 +
                             (long)local_1ac * (long)local_1b0 * (long)local_a48 * local_1c8);
          local_98 = &local_b38;
          local_720 = &local_b38;
          local_af0 = (void *)((long)local_a8 + (long)local_1ac * (long)local_a24 * local_1c8);
          local_840 = &local_b38;
          local_830 = &local_b80;
          local_a60 = 0;
          local_a68 = 0;
          local_a6c = 0;
          local_a70 = 0;
          local_a74 = 0;
          local_a78 = 0;
          local_a88 = 0;
          local_a90 = 0;
          local_a98 = 0;
          local_aa0 = 0;
          local_ab0 = 0;
          local_ab4 = 0;
          local_ab8 = 0;
          local_abc = 0;
          local_ad0 = 0;
          local_ad8 = 0;
          local_ae0 = 0;
          local_ae8 = 0;
          local_af8 = 0;
          local_b00 = 0;
          local_b04 = 0;
          local_b08 = 0;
          local_b0c = 0;
          local_b10 = 0;
          local_b20 = 0;
          local_b28 = 0;
          local_b30 = 0;
          local_b38 = 0;
          local_cc = 0x10;
          local_10c = 0x10;
          local_5bc = local_a48;
          local_604 = local_a48;
          local_620 = local_a40;
          local_624 = local_a44;
          local_625 = 1;
          local_6a0 = local_8a0;
          local_6a4 = local_a44;
          local_6a5 = 1;
          local_724 = local_a24;
          local_aa8 = 0;
          local_ac0 = 0;
          local_b80 = 0;
          local_b70 = 0;
          local_b68 = 0;
          local_b58 = 0;
          local_b54 = 0;
          local_b50 = 0;
          local_b4c = 0;
          local_b48 = 0;
          local_b40 = 0;
          local_b78 = 0;
          local_460 = local_830;
          local_440 = local_840;
          local_420 = local_850;
          local_400 = local_860;
          local_c0 = local_1d8;
          local_b4 = local_1cc;
          local_b0 = local_1c8;
          local_a0 = local_1b0;
          local_9c = local_1ac;
          local_30 = local_2b8;
          local_24 = local_2ac;
          local_20 = local_2a8;
          local_18 = local_a58;
          local_10 = local_290;
          local_c = local_28c;
          local_b60 = local_1d8;
          local_b18 = local_1d8;
          local_ac8 = local_2b8;
          local_a80 = local_2b8;
          memcpy(local_a58,local_af0,(long)local_a4c * local_8b0);
        }
      }
      local_a24 = local_a34 + local_a24;
    }
  }
  else if (((local_8a4 == 3) && (local_dd4 == 2)) || ((local_8a4 == 4 && (local_dd4 == 3)))) {
    local_b84 = local_8a0->w;
    local_b88 = local_8a0->h;
    local_b8c = local_8a0->d;
    local_b90 = local_8a0->c;
    local_b94 = 0;
    for (local_ba0 = 0; uVar1 = local_ba0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_ba0 = local_ba0 + 1) {
      local_ba4 = *(int *)(local_8b8 + local_ba0 * 4);
      if (local_ba4 == -0xe9) {
        iVar2 = local_b84 - local_b94;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_ba4 = (int)((ulong)(long)iVar2 / (sVar3 - local_ba0));
      }
      local_bb0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_ba0);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (int)in_stack_ffffffffffffefd8,(int)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
                  (int)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                  in_stack_fffffffffffff040);
      local_7b0 = local_bb0;
      bVar4 = true;
      if (local_bb0->data != (void *)0x0) {
        local_2c8 = local_bb0;
        bVar4 = local_bb0->cstep * (long)local_bb0->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_bb0->dims = local_8a4;
      for (local_bb4 = 0; local_bb4 < local_b90; local_bb4 = local_bb4 + 1) {
        local_638 = &local_c08;
        local_254 = local_bb0->w;
        local_258 = local_bb0->h;
        local_25c = local_bb0->d;
        local_bc0 = (void *)((long)local_bb0->data +
                            local_bb0->cstep * (long)local_bb4 * local_bb0->elemsize);
        local_270 = local_bb0->elemsize;
        local_274 = local_bb0->elempack;
        local_280 = local_bb0->allocator;
        local_250 = &local_c08;
        local_d8 = (long)local_254 * (long)local_258 * local_270;
        local_760 = &local_c08;
        local_820 = &local_c08;
        local_6b8 = &local_c50;
        local_174 = local_8a0->w;
        local_178 = local_8a0->h;
        local_17c = local_8a0->d;
        local_188 = (void *)((long)local_8a0->data +
                            local_8a0->cstep * (long)local_bb4 * local_8a0->elemsize);
        local_190 = local_8a0->elemsize;
        local_194 = local_8a0->elempack;
        local_1a0 = local_8a0->allocator;
        local_170 = &local_c50;
        local_118 = (long)local_174 * (long)local_178 * local_190;
        local_c10 = (local_118 + 0xfU & 0xfffffffffffffff0) / local_190;
        local_c28 = local_8a0->dims + -1;
        if (local_8a0->dims == 4) {
          local_c10 = (long)local_8a0->w * (long)local_8a0->h;
        }
        local_bd0 = 0;
        local_bd4 = 0;
        local_bd8 = 0;
        local_bdc = 0;
        local_bf0 = 0;
        local_bf8 = 0;
        local_c00 = 0;
        local_c08 = 0;
        local_c1c = 1;
        local_dc = 0x10;
        local_11c = 0x10;
        local_640 = local_bb0;
        local_644 = local_bb4;
        local_645 = 1;
        local_6c0 = local_8a0;
        local_6c4 = local_bb4;
        local_6c5 = 1;
        local_bc8 = 0;
        local_be0 = 0;
        local_c48 = (int *)0x0;
        local_480 = local_820;
        local_268 = local_bc0;
        local_c50 = local_188;
        local_c40 = local_190;
        local_c38 = local_194;
        local_c30 = local_1a0;
        local_c24 = local_174;
        local_c20 = local_178;
        local_c18 = local_17c;
        local_be8 = local_280;
        for (local_c54 = 0; local_c54 < local_b8c; local_c54 = local_c54 + 1) {
          for (local_c58 = 0; local_c58 < local_b88; local_c58 = local_c58 + 1) {
            local_5c8 = &local_ca8;
            local_5d0 = &local_c50;
            local_78 = (void *)((long)local_c50 +
                               (long)local_c24 * (long)local_c20 * (long)local_c54 * local_c40);
            local_68 = &local_ca8;
            local_730 = &local_ca8;
            local_c60 = (void *)((long)local_78 +
                                (long)local_b94 * local_8b0 +
                                (long)local_c24 * (long)local_c58 * local_c40);
            local_810 = &local_ca8;
            local_c88 = local_c30;
            local_6c = local_c24;
            local_70 = local_c20;
            local_80 = local_c40;
            local_84 = local_c38;
            local_90 = local_c30;
            local_5d4 = local_c54;
            local_734 = local_c58;
            local_ca8 = 0;
            local_c98 = 0;
            local_c90 = 0;
            local_c80 = 0;
            local_c7c = 0;
            local_c78 = 0;
            local_c74 = 0;
            local_c70 = 0;
            local_c68 = 0;
            local_ca0 = 0;
            local_4a0 = local_810;
            memcpy(local_bc0,local_c60,(long)local_ba4 * local_8b0);
            local_bc0 = (void *)((long)local_ba4 * local_8b0 + (long)local_bc0);
          }
        }
        local_800 = &local_c50;
        local_4c0 = local_800;
        if (local_c48 != (int *)0x0) {
          local_4c4 = 0xffffffff;
          LOCK();
          local_4c8 = *local_c48;
          *local_c48 = *local_c48 + -1;
          UNLOCK();
          if (local_4c8 == 1) {
            if (local_c30 == (Allocator *)0x0) {
              local_368 = local_c50;
              if (local_c50 != (void *)0x0) {
                free(local_c50);
              }
            }
            else {
              (*local_c30->_vptr_Allocator[3])(local_c30,local_c50);
            }
          }
        }
        local_c50 = (void *)0x0;
        local_c40 = 0;
        local_c38 = 0;
        local_c28 = 0;
        local_c24 = 0;
        local_c20 = 0;
        local_c1c = 0;
        local_c18 = 0;
        local_c10 = 0;
        local_c48 = (int *)0x0;
      }
      local_b94 = local_ba4 + local_b94;
    }
  }
  else if ((local_8a4 == 4) && (local_dd4 == 1)) {
    local_cac = local_8a0->w;
    local_cb0 = local_8a0->h;
    local_cb4 = local_8a0->d;
    local_cb8 = local_8a0->c;
    local_cbc = 0;
    local_8a4 = 4;
    for (local_cc8 = 0; uVar1 = local_cc8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890), uVar1 < sVar3;
        local_cc8 = local_cc8 + 1) {
      local_ccc = *(int *)(local_8b8 + local_cc8 * 4);
      if (local_ccc == -0xe9) {
        in_stack_fffffffffffff040 = (Allocator *)(long)(local_cb4 - local_cbc);
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_890);
        local_ccc = (int)((ulong)in_stack_fffffffffffff040 / (sVar3 - local_cc8));
      }
      local_cd8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_890,local_cc8);
      Mat::create(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20),
                  (int)in_stack_ffffffffffffefd8,(int)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
                  (int)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                  in_stack_fffffffffffff040);
      local_7b8 = local_cd8;
      bVar4 = true;
      if (local_cd8->data != (void *)0x0) {
        local_2c0 = local_cd8;
        bVar4 = local_cd8->cstep * (long)local_cd8->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      for (local_cdc = 0; local_cdc < local_cb8; local_cdc = local_cdc + 1) {
        local_ce0 = local_cac * local_cb0 * local_ccc;
        local_658 = &local_d30;
        local_21c = local_cd8->w;
        local_220 = local_cd8->h;
        local_224 = local_cd8->d;
        local_ce8 = (void *)((long)local_cd8->data +
                            local_cd8->cstep * (long)local_cdc * local_cd8->elemsize);
        local_238 = local_cd8->elemsize;
        local_23c = local_cd8->elempack;
        local_248 = local_cd8->allocator;
        local_218 = &local_d30;
        local_e8 = (long)local_21c * (long)local_220 * local_238;
        local_768 = &local_d30;
        local_7f0 = &local_d30;
        local_6d8 = &local_dc8;
        local_13c = local_8a0->w;
        local_140 = local_8a0->h;
        local_144 = local_8a0->d;
        local_150 = (void *)((long)local_8a0->data +
                            local_8a0->cstep * (long)local_cdc * local_8a0->elemsize);
        local_158 = local_8a0->elemsize;
        local_15c = local_8a0->elempack;
        local_168 = local_8a0->allocator;
        local_138 = &local_dc8;
        local_128 = (long)local_13c * (long)local_140 * local_158;
        local_5e0 = &local_d80;
        in_stack_ffffffffffffefe0 = &local_dc8;
        in_stack_ffffffffffffefd8 =
             (void *)((long)local_150 +
                     (long)local_13c * (long)local_140 * (long)local_cbc * local_158);
        local_38 = &local_d80;
        local_780 = &local_d80;
        in_stack_ffffffffffffefd0 = &local_d80;
        in_stack_ffffffffffffefc8 = &local_dc8;
        local_cf8 = 0;
        local_cfc = 0;
        local_d00 = 0;
        local_d04 = 0;
        local_d18 = 0;
        local_d20 = 0;
        local_d28 = 0;
        local_d30 = 0;
        local_d40 = 0;
        local_d48 = 0;
        local_d4c = 0;
        local_d50 = 0;
        local_d54 = 0;
        local_d58 = 0;
        local_d68 = 0;
        local_d70 = 0;
        local_d78 = 0;
        local_d80 = 0;
        local_ec = 0x10;
        local_12c = 0x10;
        local_5ec = local_cbc;
        local_660 = local_cd8;
        local_664 = local_cdc;
        local_665 = 1;
        local_6e0 = local_8a0;
        local_6e4 = local_cdc;
        local_6e5 = 1;
        local_cf0 = 0;
        local_d08 = 0;
        local_dc8.data = (void *)0x0;
        local_dc8.elemsize = 0;
        local_dc8.elempack = 0;
        local_dc8.dims = 0;
        local_dc8.w = 0;
        local_dc8.h = 0;
        local_dc8.d = 0;
        local_dc8.c = 0;
        local_dc8.cstep = 0;
        local_dc8.refcount = (int *)0x0;
        local_d38 = in_stack_ffffffffffffefd8;
        local_7e0 = in_stack_ffffffffffffefd0;
        local_7d0 = in_stack_ffffffffffffefc8;
        local_5e8 = in_stack_ffffffffffffefe0;
        local_520 = in_stack_ffffffffffffefc8;
        local_500 = in_stack_ffffffffffffefd0;
        local_4e0 = local_7f0;
        local_230 = local_ce8;
        local_60 = local_168;
        local_54 = local_15c;
        local_50 = local_158;
        local_48 = in_stack_ffffffffffffefd8;
        local_40 = local_140;
        local_3c = local_13c;
        local_dc8.allocator = local_168;
        local_d60 = local_168;
        local_d10 = local_248;
        memcpy(local_ce8,in_stack_ffffffffffffefd8,(long)local_ce0 * local_8b0);
      }
      local_cbc = local_ccc + local_cbc;
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((d - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}